

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::InstanceArraySymbol::serializeTo(InstanceArraySymbol *this,ASTSerializer *serializer)

{
  string local_30;
  
  ConstantRange::toString_abi_cxx11_(&local_30,&this->range);
  ASTSerializer::write(serializer,5,"range",(size_t)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void InstanceArraySymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("range", range.toString());
}